

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::timeRequest
          (TimeCoordinator *this,Time nextTime,IterationRequest iterate,Time newValueTime,
          Time newMessageTime)

{
  int32_t *piVar1;
  long lVar2;
  Time TVar3;
  TimeRepresentation<count_time<9,_long>_> TVar4;
  initializer_list<TimeRepresentation<count_time<9,_long>_>_> __l;
  TimeRepresentation<count_time<9,_long>_> local_38;
  long local_30;
  long local_28;
  
  this->iterating = iterate;
  if (iterate == NO_ITERATIONS) {
    TVar3 = getNextPossibleTime(this);
    (this->time_next).internalTimeCode = TVar3.internalTimeCode;
    if (nextTime.internalTimeCode < TVar3.internalTimeCode) {
      nextTime = TVar3;
    }
    local_28 = nextTime.internalTimeCode;
    if ((this->info).uninterruptible == true) {
      TVar3 = generateAllowedTime(this,nextTime);
      (this->time_next).internalTimeCode = TVar3.internalTimeCode;
    }
  }
  else {
    lVar2 = (this->time_granted).internalTimeCode;
    if (nextTime.internalTimeCode < lVar2) {
      nextTime.internalTimeCode = lVar2;
    }
    local_28 = nextTime.internalTimeCode;
    if (iterate == FORCE_ITERATION) {
      local_28 = lVar2;
    }
  }
  (this->time_requested).internalTimeCode = local_28;
  lVar2 = (&this->time_granted)[(ulong)(this->iterating == NO_ITERATIONS) * 2].internalTimeCode;
  local_38.internalTimeCode = newValueTime.internalTimeCode;
  if (newValueTime.internalTimeCode < lVar2) {
    local_38.internalTimeCode = lVar2;
  }
  local_30 = newMessageTime.internalTimeCode;
  if (newMessageTime.internalTimeCode < lVar2) {
    local_30 = lVar2;
  }
  (this->time_value).internalTimeCode = local_38.internalTimeCode;
  (this->time_message).internalTimeCode = local_30;
  __l._M_len = 3;
  __l._M_array = &local_38;
  TVar4 = std::min<TimeRepresentation<count_time<9,long>>>(__l);
  (this->time_exec).internalTimeCode = TVar4.internalTimeCode;
  TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
  if (((this->info).uninterruptible == true) &&
     ((TVar3.internalTimeCode < TVar4.internalTimeCode || (this->iterating == NO_ITERATIONS)))) {
    (this->time_exec).internalTimeCode = (this->time_requested).internalTimeCode;
  }
  TimeDependencies::resetDependentEvents(&(this->super_BaseTimeCoordinator).dependencies,TVar3);
  piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
  *piVar1 = *piVar1 + 1;
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])(this);
  if ((this->super_BaseTimeCoordinator).dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_BaseTimeCoordinator).dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    sendTimeRequest(this,(GlobalFederateId)0x8831d580);
  }
  return;
}

Assistant:

void TimeCoordinator::timeRequest(Time nextTime,
                                  IterationRequest iterate,
                                  Time newValueTime,
                                  Time newMessageTime)
{
    iterating = iterate;

    if (iterating != IterationRequest::NO_ITERATIONS) {
        if (nextTime < time_granted || iterating == IterationRequest::FORCE_ITERATION) {
            nextTime = time_granted;
        }
    } else {
        time_next = getNextPossibleTime();
        if (nextTime < time_next) {
            nextTime = time_next;
        }
        if (info.uninterruptible) {
            time_next = generateAllowedTime(nextTime);
        }
    }
    time_requested = nextTime;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        time_value = (newValueTime > time_granted) ? newValueTime : time_granted;
        time_message = (newMessageTime > time_granted) ? newMessageTime : time_granted;
    } else {
        time_value = (newValueTime > time_next) ? newValueTime : time_next;
        time_message = (newMessageTime > time_next) ? newMessageTime : time_next;
    }

    time_exec = std::min({time_value, time_message, time_requested});
    if (info.uninterruptible) {
        if (time_exec > time_granted || iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = time_requested;
        }
    }
    dependencies.resetDependentEvents(time_granted);
    ++sequenceCounter;
    updateTimeFactors();

    if (!dependencies.empty()) {
        sendTimeRequest(GlobalFederateId{});
    }
}